

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

int ParseSighashString(UniValue *sighash)

{
  long lVar1;
  string *sighash_00;
  T *pTVar2;
  UniValue *__return_storage_ptr__;
  int iVar3;
  long in_FS_OFFSET;
  bilingual_str bStack_a8;
  Result<int> result;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (sighash->typ == VNULL) {
    iVar3 = 0;
  }
  else {
    sighash_00 = UniValue::get_str_abi_cxx11_(sighash);
    SighashFromStr(&result,sighash_00);
    if (result.m_variant.super__Variant_base<bilingual_str,_int>.
        super__Move_assign_alias<bilingual_str,_int>.super__Copy_assign_alias<bilingual_str,_int>.
        super__Move_ctor_alias<bilingual_str,_int>.super__Copy_ctor_alias<bilingual_str,_int>.
        super__Variant_storage_alias<bilingual_str,_int>._M_index != '\x01') {
      __return_storage_ptr__ = (UniValue *)__cxa_allocate_exception(0x58);
      util::ErrorString<int>(&bStack_a8,&result);
      JSONRPCError(__return_storage_ptr__,-8,&bStack_a8.original);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(__return_storage_ptr__,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_002f7260;
    }
    pTVar2 = util::Result<int>::value(&result);
    iVar3 = *pTVar2;
    std::__detail::__variant::_Variant_storage<false,_bilingual_str,_int>::~_Variant_storage
              ((_Variant_storage<false,_bilingual_str,_int> *)&result);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar3;
  }
LAB_002f7260:
  __stack_chk_fail();
}

Assistant:

int ParseSighashString(const UniValue& sighash)
{
    if (sighash.isNull()) {
        return SIGHASH_DEFAULT;
    }
    const auto result{SighashFromStr(sighash.get_str())};
    if (!result) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, util::ErrorString(result).original);
    }
    return result.value();
}